

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_oFFs(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  uint offset_y;
  uint offset_x;
  char *error_message;
  png_byte buf [9];
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 4) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x100) == 0)) {
      if (length == 9) {
        png_crc_read(png_ptr,buf,9);
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          if ((char)buf[0] < '\0') {
            offset_x = -((uint)buf[1] * 0x7fff0000 -
                         ((uint)buf[3] | (uint)buf[2] << 8 | (uint)buf[0] << 0x18) & 0x7fffffff);
          }
          else {
            offset_x = (uint)buf[3] |
                       (uint)buf[2] << 8 | (uint)buf[1] << 0x10 | (uint)buf[0] << 0x18;
          }
          if ((char)buf[4] < '\0') {
            offset_y = -((uint)buf[5] * 0x7fff0000 -
                         ((uint)buf[7] | (uint)buf[6] << 8 | (uint)buf[4] << 0x18) & 0x7fffffff);
          }
          else {
            offset_y = (uint)buf[7] |
                       (uint)buf[6] << 8 | (uint)buf[5] << 0x10 | (uint)buf[4] << 0x18;
          }
          png_set_oFFs(png_ptr,info_ptr,offset_x,offset_y,(uint)buf[8]);
        }
        return;
      }
      png_crc_finish(png_ptr,length);
      error_message = "invalid";
    }
    else {
      png_crc_finish(png_ptr,length);
      error_message = "duplicate";
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_oFFs(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[9];
   png_int_32 offset_x, offset_y;
   int unit_type;

   png_debug(1, "in png_handle_oFFs");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_oFFs) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (length != 9)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 9);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   offset_x = png_get_int_32(buf);
   offset_y = png_get_int_32(buf + 4);
   unit_type = buf[8];
   png_set_oFFs(png_ptr, info_ptr, offset_x, offset_y, unit_type);
}